

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_general.h
# Opt level: O0

Violation __thiscall
mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>>::
ComputeViolation<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
          (ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_> *this,
          VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  Violation VVar1;
  bool bVar2;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *in_RSI;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *in_RDI;
  double dVar3;
  double ve;
  int i;
  AlgebraicExpression<mp::QuadAndLinTerms> *in_stack_fffffffffffffff0;
  
  dVar3 = AlgebraicExpression<mp::QuadAndLinTerms>::
          ComputeValue<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                    (in_stack_fffffffffffffff0,in_RDI);
  i = (int)((ulong)dVar3 >> 0x20);
  bVar2 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::is_at_lb(in_RSI,i);
  if (bVar2) {
    dVar3 = -dVar3;
  }
  else {
    bVar2 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::is_at_ub(in_RSI,i);
    if (!bVar2) {
      dVar3 = ABS(dVar3);
    }
  }
  VVar1.valX_ = 0.0;
  VVar1.viol_ = dVar3;
  return VVar1;
}

Assistant:

Violation ComputeViolation(const VarInfo& x) const {
    auto ve = compl_expr_.ComputeValue(x);
    if (x.is_at_lb(compl_var_))
      return {-ve, 0.0};
    else if (x.is_at_ub(compl_var_))
      return {ve, 0.0};
    return {std::fabs(ve), 0.0};
  }